

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_islow(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE JVar1;
  JSAMPLE *pJVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  JSAMPROW pJVar15;
  JSAMPLE aJStack_1b8 [3];
  JSAMPLE dcval_1;
  int dcval;
  int workspace [64];
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  INT32 z3;
  INT32 z2;
  INT32 z1;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  JDIMENSION output_col_local;
  JSAMPARRAY output_buf_local;
  JCOEFPTR coef_block_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  pJVar2 = cinfo->sample_range_limit;
  wsptr = (int *)compptr->dct_table;
  outptr = aJStack_1b8;
  quantptr = (ISLOW_MULT_TYPE *)coef_block;
  for (workspace[0x3f] = 8; 0 < workspace[0x3f]; workspace[0x3f] = workspace[0x3f] + -1) {
    if (((((short)quantptr[4] == 0) && ((short)quantptr[8] == 0)) &&
        (((short)quantptr[0xc] == 0 &&
         ((((short)quantptr[0x10] == 0 && ((short)quantptr[0x14] == 0)) &&
          ((short)quantptr[0x18] == 0)))))) && ((short)quantptr[0x1c] == 0)) {
      iVar3 = (int)(short)*quantptr * *wsptr * 4;
      *(int *)outptr = iVar3;
      *(int *)(outptr + 0x20) = iVar3;
      *(int *)(outptr + 0x40) = iVar3;
      *(int *)(outptr + 0x60) = iVar3;
      *(int *)(outptr + 0x80) = iVar3;
      *(int *)(outptr + 0xa0) = iVar3;
      *(int *)(outptr + 0xc0) = iVar3;
      *(int *)(outptr + 0xe0) = iVar3;
    }
    else {
      lVar4 = (long)((int)(short)quantptr[8] * wsptr[0x10]);
      lVar5 = (long)((int)(short)quantptr[0x18] * wsptr[0x30]);
      lVar6 = (lVar4 + lVar5) * 0x1151;
      lVar4 = lVar6 + lVar4 * 0x187e;
      lVar6 = lVar6 + lVar5 * -0x3b21;
      lVar5 = (long)((int)(short)quantptr[0x10] * wsptr[0x20]);
      lVar7 = (long)((int)(short)*quantptr * *wsptr) * 0x2000 + 0x400;
      lVar8 = lVar7 + lVar5 * 0x2000;
      lVar7 = lVar7 + lVar5 * -0x2000;
      lVar5 = lVar8 + lVar4;
      lVar8 = lVar8 - lVar4;
      lVar4 = lVar7 + lVar6;
      lVar7 = lVar7 - lVar6;
      lVar6 = (long)((int)(short)quantptr[0x1c] * wsptr[0x38]);
      lVar9 = (long)((int)(short)quantptr[0x14] * wsptr[0x28]);
      lVar10 = (long)((int)(short)quantptr[0xc] * wsptr[0x18]);
      lVar11 = (long)((int)(short)quantptr[4] * wsptr[8]);
      lVar12 = (lVar6 + lVar10 + lVar9 + lVar11) * 0x25a1;
      lVar13 = lVar12 + (lVar6 + lVar10) * -0x3ec5;
      lVar12 = lVar12 + (lVar9 + lVar11) * -0xc7c;
      lVar14 = (lVar6 + lVar11) * -0x1ccd;
      lVar6 = lVar14 + lVar13 + lVar6 * 0x98e;
      lVar11 = lVar14 + lVar12 + lVar11 * 0x300b;
      lVar14 = (lVar9 + lVar10) * -0x5203;
      lVar9 = lVar14 + lVar12 + lVar9 * 0x41b3;
      lVar10 = lVar14 + lVar13 + lVar10 * 0x6254;
      *(int *)outptr = (int)(lVar5 + lVar11 >> 0xb);
      *(int *)(outptr + 0xe0) = (int)(lVar5 - lVar11 >> 0xb);
      *(int *)(outptr + 0x20) = (int)(lVar4 + lVar10 >> 0xb);
      *(int *)(outptr + 0xc0) = (int)(lVar4 - lVar10 >> 0xb);
      *(int *)(outptr + 0x40) = (int)(lVar7 + lVar9 >> 0xb);
      *(int *)(outptr + 0xa0) = (int)(lVar7 - lVar9 >> 0xb);
      *(int *)(outptr + 0x60) = (int)(lVar8 + lVar6 >> 0xb);
      *(int *)(outptr + 0x80) = (int)(lVar8 - lVar6 >> 0xb);
    }
    quantptr = (ISLOW_MULT_TYPE *)((long)quantptr + 2);
    wsptr = wsptr + 1;
    outptr = outptr + 4;
  }
  outptr = aJStack_1b8;
  for (workspace[0x3f] = 0; workspace[0x3f] < 8; workspace[0x3f] = workspace[0x3f] + 1) {
    pJVar15 = output_buf[workspace[0x3f]] + output_col;
    if ((((*(int *)(outptr + 4) == 0) && (*(int *)(outptr + 8) == 0)) &&
        (*(int *)(outptr + 0xc) == 0)) &&
       (((*(int *)(outptr + 0x10) == 0 && (*(int *)(outptr + 0x14) == 0)) &&
        ((*(int *)(outptr + 0x18) == 0 && (*(int *)(outptr + 0x1c) == 0)))))) {
      JVar1 = pJVar2[(long)(int)((uint)((long)*(int *)outptr + 0x10 >> 5) & 0x3ff) + 0x80];
      *pJVar15 = JVar1;
      pJVar15[1] = JVar1;
      pJVar15[2] = JVar1;
      pJVar15[3] = JVar1;
      pJVar15[4] = JVar1;
      pJVar15[5] = JVar1;
      pJVar15[6] = JVar1;
      pJVar15[7] = JVar1;
    }
    else {
      lVar5 = ((long)*(int *)(outptr + 8) + (long)*(int *)(outptr + 0x18)) * 0x1151;
      lVar4 = lVar5 + (long)*(int *)(outptr + 8) * 0x187e;
      lVar5 = lVar5 + (long)*(int *)(outptr + 0x18) * -0x3b21;
      lVar8 = ((long)*(int *)outptr + 0x10 + (long)*(int *)(outptr + 0x10)) * 0x2000;
      lVar7 = (((long)*(int *)outptr + 0x10) - (long)*(int *)(outptr + 0x10)) * 0x2000;
      lVar6 = lVar8 + lVar4;
      lVar8 = lVar8 - lVar4;
      lVar4 = lVar7 + lVar5;
      lVar7 = lVar7 - lVar5;
      lVar5 = (long)*(int *)(outptr + 0x1c);
      lVar9 = (long)*(int *)(outptr + 0x14);
      lVar10 = (long)*(int *)(outptr + 0xc);
      lVar11 = (long)*(int *)(outptr + 4);
      lVar12 = (lVar5 + lVar10 + lVar9 + lVar11) * 0x25a1;
      lVar13 = lVar12 + (lVar5 + lVar10) * -0x3ec5;
      lVar12 = lVar12 + (lVar9 + lVar11) * -0xc7c;
      lVar14 = (lVar5 + lVar11) * -0x1ccd;
      lVar5 = lVar14 + lVar13 + lVar5 * 0x98e;
      lVar11 = lVar14 + lVar12 + lVar11 * 0x300b;
      lVar14 = (lVar9 + lVar10) * -0x5203;
      lVar9 = lVar14 + lVar12 + lVar9 * 0x41b3;
      lVar10 = lVar14 + lVar13 + lVar10 * 0x6254;
      *pJVar15 = pJVar2[(long)(int)((uint)(lVar6 + lVar11 >> 0x12) & 0x3ff) + 0x80];
      pJVar15[7] = pJVar2[(long)(int)((uint)(lVar6 - lVar11 >> 0x12) & 0x3ff) + 0x80];
      pJVar15[1] = pJVar2[(long)(int)((uint)(lVar4 + lVar10 >> 0x12) & 0x3ff) + 0x80];
      pJVar15[6] = pJVar2[(long)(int)((uint)(lVar4 - lVar10 >> 0x12) & 0x3ff) + 0x80];
      pJVar15[2] = pJVar2[(long)(int)((uint)(lVar7 + lVar9 >> 0x12) & 0x3ff) + 0x80];
      pJVar15[5] = pJVar2[(long)(int)((uint)(lVar7 - lVar9 >> 0x12) & 0x3ff) + 0x80];
      pJVar15[3] = pJVar2[(long)(int)((uint)(lVar8 + lVar5 >> 0x12) & 0x3ff) + 0x80];
      pJVar15[4] = pJVar2[(long)(int)((uint)(lVar8 - lVar5 >> 0x12) & 0x3ff) + 0x80];
    }
    outptr = outptr + 0x20;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_islow (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		 JCOEFPTR coef_block,
		 JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12, tmp13;
  INT32 z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */
  /* Note results are scaled up by sqrt(8) compared to a true IDCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE*1] == 0 && inptr[DCTSIZE*2] == 0 &&
	inptr[DCTSIZE*3] == 0 && inptr[DCTSIZE*4] == 0 &&
	inptr[DCTSIZE*5] == 0 && inptr[DCTSIZE*6] == 0 &&
	inptr[DCTSIZE*7] == 0) {
      /* AC terms all zero */
      int dcval = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]) << PASS1_BITS;

      wsptr[DCTSIZE*0] = dcval;
      wsptr[DCTSIZE*1] = dcval;
      wsptr[DCTSIZE*2] = dcval;
      wsptr[DCTSIZE*3] = dcval;
      wsptr[DCTSIZE*4] = dcval;
      wsptr[DCTSIZE*5] = dcval;
      wsptr[DCTSIZE*6] = dcval;
      wsptr[DCTSIZE*7] = dcval;

      inptr++;			/* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */
    
    z2 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z2, FIX_0_765366865);
    tmp3 = z1 - MULTIPLY(z3, FIX_1_847759065);

    z2 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    z2 <<= CONST_BITS;
    z3 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    z2 += ONE << (CONST_BITS-PASS1_BITS-1);

    tmp0 = z2 + z3;
    tmp1 = z2 - z3;

    tmp10 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;
    tmp11 = tmp1 + tmp3;
    tmp12 = tmp1 - tmp3;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    
    z2 = tmp0 + tmp2;
    z3 = tmp1 + tmp3;

    z1 = MULTIPLY(z2 + z3, FIX_1_175875602); /* sqrt(2) * c3 */
    z2 = MULTIPLY(z2, - FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z3 = MULTIPLY(z3, - FIX_0_390180644); /* sqrt(2) * (c5-c3) */
    z2 += z1;
    z3 += z1;

    z1 = MULTIPLY(tmp0 + tmp3, - FIX_0_899976223); /* sqrt(2) * (c7-c3) */
    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    tmp0 += z1 + z2;
    tmp3 += z1 + z3;

    z1 = MULTIPLY(tmp1 + tmp2, - FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp1 += z1 + z3;
    tmp2 += z1 + z2;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    wsptr[DCTSIZE*0] = (int) RIGHT_SHIFT(tmp10 + tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*7] = (int) RIGHT_SHIFT(tmp10 - tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*1] = (int) RIGHT_SHIFT(tmp11 + tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*6] = (int) RIGHT_SHIFT(tmp11 - tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*2] = (int) RIGHT_SHIFT(tmp12 + tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*5] = (int) RIGHT_SHIFT(tmp12 - tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*3] = (int) RIGHT_SHIFT(tmp13 + tmp0, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*4] = (int) RIGHT_SHIFT(tmp13 - tmp0, CONST_BITS-PASS1_BITS);
    
    inptr++;			/* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
	wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int) DESCALE((INT32) wsptr[0], PASS1_BITS+3)
				  & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;		/* advance pointer to next row */
      continue;
    }
#endif

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */
    
    z2 = (INT32) wsptr[2];
    z3 = (INT32) wsptr[6];

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z2, FIX_0_765366865);
    tmp3 = z1 - MULTIPLY(z3, FIX_1_847759065);

    /* Add fudge factor here for final descale. */
    z2 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    z3 = (INT32) wsptr[4];

    tmp0 = (z2 + z3) << CONST_BITS;
    tmp1 = (z2 - z3) << CONST_BITS;
    
    tmp10 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;
    tmp11 = tmp1 + tmp3;
    tmp12 = tmp1 - tmp3;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = (INT32) wsptr[7];
    tmp1 = (INT32) wsptr[5];
    tmp2 = (INT32) wsptr[3];
    tmp3 = (INT32) wsptr[1];

    z2 = tmp0 + tmp2;
    z3 = tmp1 + tmp3;

    z1 = MULTIPLY(z2 + z3, FIX_1_175875602); /* sqrt(2) * c3 */
    z2 = MULTIPLY(z2, - FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z3 = MULTIPLY(z3, - FIX_0_390180644); /* sqrt(2) * (c5-c3) */
    z2 += z1;
    z3 += z1;

    z1 = MULTIPLY(tmp0 + tmp3, - FIX_0_899976223); /* sqrt(2) * (c7-c3) */
    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    tmp0 += z1 + z2;
    tmp3 += z1 + z3;

    z1 = MULTIPLY(tmp1 + tmp2, - FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp1 += z1 + z3;
    tmp2 += z1 + z2;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    outptr[0] = range_limit[(int) RIGHT_SHIFT(tmp10 + tmp3,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[7] = range_limit[(int) RIGHT_SHIFT(tmp10 - tmp3,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[(int) RIGHT_SHIFT(tmp11 + tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[6] = range_limit[(int) RIGHT_SHIFT(tmp11 - tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[(int) RIGHT_SHIFT(tmp12 + tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[5] = range_limit[(int) RIGHT_SHIFT(tmp12 - tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[(int) RIGHT_SHIFT(tmp13 + tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[4] = range_limit[(int) RIGHT_SHIFT(tmp13 - tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];

    wsptr += DCTSIZE;		/* advance pointer to next row */
  }
}